

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demux.c
# Opt level: O2

ParseStatus StoreFrame(int frame_num,uint32_t min_size,MemBuffer_conflict *mem,Frame *frame)

{
  size_t sVar1;
  size_t data_size;
  int iVar2;
  uint uVar3;
  uint8_t *puVar4;
  bool bVar5;
  bool bVar6;
  VP8StatusCode VVar7;
  ParseStatus PVar8;
  byte bVar9;
  size_t sVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  size_t sVar14;
  WebPBitstreamFeatures features;
  
  sVar14 = mem->start_;
  sVar10 = mem->end_;
  if (sVar10 - sVar14 < (ulong)min_size || sVar10 - sVar14 < 8) {
LAB_001424d6:
    PVar8 = PARSE_NEED_MORE_DATA;
  }
  else {
    bVar5 = false;
    bVar6 = false;
    do {
      puVar4 = mem->buf_;
      iVar2 = *(int *)(puVar4 + sVar14);
      mem->start_ = sVar14 + 4;
      uVar3 = *(uint *)(puVar4 + sVar14 + 4);
      sVar1 = sVar14 + 8;
      mem->start_ = sVar1;
      if (0xfffffff6 < uVar3) {
        return PARSE_ERROR;
      }
      uVar12 = (ulong)((uVar3 & 1) + uVar3);
      uVar11 = sVar10 - sVar1;
      uVar13 = uVar12;
      if (uVar11 < uVar12) {
        uVar13 = uVar11;
      }
      sVar10 = mem->riff_end_;
      if (sVar10 - sVar1 < uVar12) {
        return PARSE_ERROR;
      }
      data_size = uVar13 + 8;
      if (iVar2 == 0x20385056) {
LAB_001425aa:
        if (bVar5) {
LAB_001425ae:
          mem->start_ = sVar14;
          bVar9 = 0;
        }
        else {
          VVar7 = WebPGetFeatures(puVar4 + sVar14,data_size,&features);
          if ((uVar11 < uVar12) && (VVar7 == VP8_STATUS_NOT_ENOUGH_DATA)) goto LAB_001424d6;
          bVar5 = true;
          if (VVar7 != VP8_STATUS_OK) {
            return PARSE_ERROR;
          }
          frame->img_components_[0].offset_ = sVar14;
          frame->img_components_[0].size_ = data_size;
          frame->width_ = features.width;
          frame->height_ = features.height;
          frame->has_alpha_ = frame->has_alpha_ | features.has_alpha;
          frame->frame_num_ = frame_num;
          frame->complete_ = (uint)(uVar12 <= uVar11);
          sVar14 = uVar13 + mem->start_;
          mem->start_ = sVar14;
          sVar10 = mem->riff_end_;
          bVar9 = 1;
        }
      }
      else {
        if (iVar2 == 0x4c385056) {
          if (bVar6) {
            return PARSE_ERROR;
          }
          goto LAB_001425aa;
        }
        if ((iVar2 != 0x48504c41) || (bVar6)) goto LAB_001425ae;
        frame->img_components_[1].offset_ = sVar14;
        frame->img_components_[1].size_ = data_size;
        frame->has_alpha_ = 1;
        frame->frame_num_ = frame_num;
        sVar14 = uVar13 + sVar1;
        mem->start_ = sVar14;
        bVar9 = 1;
        bVar6 = true;
      }
      if (sVar14 == sVar10) {
        return (uint)(uVar11 < uVar12);
      }
      sVar10 = mem->end_;
      PVar8 = (uint)(uVar11 < uVar12);
      if (sVar10 - sVar14 < 8) {
        PVar8 = PARSE_NEED_MORE_DATA;
      }
    } while ((bool)(bVar9 & PVar8 == PARSE_OK));
  }
  return PVar8;
}

Assistant:

static ParseStatus StoreFrame(int frame_num, uint32_t min_size,
                              MemBuffer* const mem, Frame* const frame) {
  int alpha_chunks = 0;
  int image_chunks = 0;
  int done = (MemDataSize(mem) < CHUNK_HEADER_SIZE ||
              MemDataSize(mem) < min_size);
  ParseStatus status = PARSE_OK;

  if (done) return PARSE_NEED_MORE_DATA;

  do {
    const size_t chunk_start_offset = mem->start_;
    const uint32_t fourcc = ReadLE32(mem);
    const uint32_t payload_size = ReadLE32(mem);
    uint32_t payload_size_padded;
    size_t payload_available;
    size_t chunk_size;

    if (payload_size > MAX_CHUNK_PAYLOAD) return PARSE_ERROR;

    payload_size_padded = payload_size + (payload_size & 1);
    payload_available = (payload_size_padded > MemDataSize(mem))
                      ? MemDataSize(mem) : payload_size_padded;
    chunk_size = CHUNK_HEADER_SIZE + payload_available;
    if (SizeIsInvalid(mem, payload_size_padded)) return PARSE_ERROR;
    if (payload_size_padded > MemDataSize(mem)) status = PARSE_NEED_MORE_DATA;

    switch (fourcc) {
      case MKFOURCC('A', 'L', 'P', 'H'):
        if (alpha_chunks == 0) {
          ++alpha_chunks;
          frame->img_components_[1].offset_ = chunk_start_offset;
          frame->img_components_[1].size_ = chunk_size;
          frame->has_alpha_ = 1;
          frame->frame_num_ = frame_num;
          Skip(mem, payload_available);
        } else {
          goto Done;
        }
        break;
      case MKFOURCC('V', 'P', '8', 'L'):
        if (alpha_chunks > 0) return PARSE_ERROR;  // VP8L has its own alpha
        // fall through
      case MKFOURCC('V', 'P', '8', ' '):
        if (image_chunks == 0) {
          // Extract the bitstream features, tolerating failures when the data
          // is incomplete.
          WebPBitstreamFeatures features;
          const VP8StatusCode vp8_status =
              WebPGetFeatures(mem->buf_ + chunk_start_offset, chunk_size,
                              &features);
          if (status == PARSE_NEED_MORE_DATA &&
              vp8_status == VP8_STATUS_NOT_ENOUGH_DATA) {
            return PARSE_NEED_MORE_DATA;
          } else if (vp8_status != VP8_STATUS_OK) {
            // We have enough data, and yet WebPGetFeatures() failed.
            return PARSE_ERROR;
          }
          ++image_chunks;
          SetFrameInfo(chunk_start_offset, chunk_size, frame_num,
                       status == PARSE_OK, &features, frame);
          Skip(mem, payload_available);
        } else {
          goto Done;
        }
        break;
 Done:
      default:
        // Restore fourcc/size when moving up one level in parsing.
        Rewind(mem, CHUNK_HEADER_SIZE);
        done = 1;
        break;
    }

    if (mem->start_ == mem->riff_end_) {
      done = 1;
    } else if (MemDataSize(mem) < CHUNK_HEADER_SIZE) {
      status = PARSE_NEED_MORE_DATA;
    }
  } while (!done && status == PARSE_OK);

  return status;
}